

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O2

Roaring * __thiscall
roaring::Roaring::operator-(Roaring *__return_storage_ptr__,Roaring *this,Roaring *o)

{
  roaring_bitmap_t *s;
  runtime_error *this_00;
  
  s = (roaring_bitmap_t *)roaring_bitmap_andnot((roaring_bitmap_t *)this,(roaring_bitmap_t *)o);
  if (s != (roaring_bitmap_t *)0x0) {
    Roaring(__return_storage_ptr__,s);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"failed materalization in andnot");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Roaring operator-(const Roaring &o) const {
        roaring_bitmap_t *r = api::roaring_bitmap_andnot(&roaring, &o.roaring);
        if (r == NULL) {
            ROARING_TERMINATE("failed materalization in andnot");
        }
        return Roaring(r);
    }